

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode H1_CONNECT(Curl_cfilter *cf,Curl_easy *data,h1_tunnel_state_conflict *ts)

{
  _Bool _Var1;
  int iVar2;
  timediff_t tVar3;
  timediff_t check;
  _Bool done;
  connectdata *pcStack_30;
  CURLcode result;
  connectdata *conn;
  h1_tunnel_state_conflict *ts_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pcStack_30 = cf->conn;
  conn = (connectdata *)ts;
  ts_local = (h1_tunnel_state_conflict *)data;
  data_local = (Curl_easy *)cf;
  _Var1 = tunnel_is_established(ts);
  if (_Var1) {
    cf_local._4_4_ = CURLE_OK;
  }
  else {
    _Var1 = tunnel_is_failed((h1_tunnel_state_conflict *)conn);
    if (_Var1) {
      cf_local._4_4_ = CURLE_RECV_ERROR;
    }
    else {
      do {
        tVar3 = Curl_timeleft((Curl_easy *)ts_local,(curltime *)0x0,true);
        if (tVar3 < 1) {
          Curl_failf((Curl_easy *)ts_local,"Proxy CONNECT aborted due to timeout");
          check._4_4_ = CURLE_OPERATION_TIMEDOUT;
          goto LAB_00c1f46d;
        }
        switch(*(undefined4 *)(conn->primary_ip + 0x18)) {
        case 0:
          if ((((ts_local != (h1_tunnel_state_conflict *)0x0) &&
               ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) &&
              (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
            Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,"CONNECT start");
          }
          check._4_4_ = start_CONNECT((Curl_cfilter *)data_local,(Curl_easy *)ts_local,
                                      (h1_tunnel_state_conflict *)conn);
          if (check._4_4_ != CURLE_OK) goto LAB_00c1f46d;
          h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                             H1_TUNNEL_CONNECT,(Curl_easy *)ts_local);
          break;
        case 1:
          break;
        case 2:
          goto switchD_00c1f05d_caseD_2;
        case 3:
          goto switchD_00c1f05d_caseD_3;
        default:
          goto switchD_00c1f05d_default;
        }
        if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
            ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) &&
           ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
          Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,"CONNECT send");
        }
        check._4_4_ = send_CONNECT((Curl_cfilter *)data_local,(Curl_easy *)ts_local,
                                   (h1_tunnel_state_conflict *)conn,(_Bool *)((long)&check + 3));
        if ((check._4_4_ != CURLE_OK) || ((check._3_1_ & 1) == 0)) goto LAB_00c1f46d;
        h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                           H1_TUNNEL_RECEIVE,(Curl_easy *)ts_local);
switchD_00c1f05d_caseD_2:
        if ((((ts_local != (h1_tunnel_state_conflict *)0x0) &&
             ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) &&
            (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
          Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,"CONNECT receive");
        }
        check._4_4_ = recv_CONNECT_resp((Curl_cfilter *)data_local,(Curl_easy *)ts_local,
                                        (h1_tunnel_state_conflict *)conn,(_Bool *)((long)&check + 3)
                                       );
        iVar2 = Curl_pgrsUpdate((Curl_easy *)ts_local);
        if (iVar2 != 0) {
          check._4_4_ = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_00c1f46d;
        }
        if ((check._4_4_ != CURLE_OK) || ((check._3_1_ & 1) == 0)) goto LAB_00c1f46d;
        h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                           H1_TUNNEL_RESPONSE,(Curl_easy *)ts_local);
switchD_00c1f05d_caseD_3:
        if (((ts_local != (h1_tunnel_state_conflict *)0x0) &&
            ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) &&
           ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
          Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,"CONNECT response");
        }
        if (ts_local[1].CONNECT.h3_ctx != (void *)0x0) {
          if ((((byte)conn->primary_ip[0x1c] >> 1 & 1) != 0) ||
             (((uint)pcStack_30->bits >> 6 & 1) != 0)) {
            if ((ts_local != (h1_tunnel_state_conflict *)0x0) &&
               ((((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0 &&
                 (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))))) {
              Curl_trc_cf_infof((Curl_easy *)ts_local,(Curl_cfilter *)data_local,
                                "CONNECT need to close+open");
            }
            if ((ts_local != (h1_tunnel_state_conflict *)0x0) &&
               ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) {
              Curl_infof((Curl_easy *)ts_local,"Connect me again please");
            }
            Curl_conn_cf_close((Curl_cfilter *)data_local,(Curl_easy *)ts_local);
            Curl_conncontrol(pcStack_30,0);
            check._4_4_ = Curl_conn_cf_connect
                                    ((Curl_cfilter *)data_local->id,(Curl_easy *)ts_local,false,
                                     (_Bool *)((long)&check + 3));
            goto LAB_00c1f46d;
          }
          h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                             H1_TUNNEL_INIT,(Curl_easy *)ts_local);
        }
switchD_00c1f05d_default:
      } while (ts_local[1].CONNECT.h3_ctx != (void *)0x0);
      if (*(int *)&ts_local[0x11].CONNECT.field_0x3c / 100 == 2) {
        h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                           H1_TUNNEL_ESTABLISHED,(Curl_easy *)ts_local);
        if ((ts_local != (h1_tunnel_state_conflict *)0x0) &&
           ((*(ulong *)((long)&ts_local[9].CONNECT.backup.data + 2) >> 0x1c & 1) != 0)) {
          Curl_infof((Curl_easy *)ts_local,"CONNECT tunnel established, response %d",
                     (ulong)*(uint *)&ts_local[0x11].CONNECT.field_0x3c);
        }
        check._4_4_ = CURLE_OK;
LAB_00c1f46d:
        if (check._4_4_ != CURLE_OK) {
          h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                             H1_TUNNEL_FAILED,(Curl_easy *)ts_local);
        }
        cf_local._4_4_ = check._4_4_;
      }
      else {
        (*Curl_cfree)(ts_local[1].CONNECT.h3_ctx);
        ts_local[1].CONNECT.h3_ctx = (void *)0x0;
        Curl_conncontrol(pcStack_30,2);
        h1_tunnel_go_state((Curl_cfilter *)data_local,(h1_tunnel_state_conflict *)conn,
                           H1_TUNNEL_FAILED,(Curl_easy *)ts_local);
        Curl_failf((Curl_easy *)ts_local,"CONNECT tunnel failed, response %d",
                   (ulong)*(uint *)&ts_local[1].CONNECT.postdata);
        cf_local._4_4_ = CURLE_RECV_ERROR;
      }
    }
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode H1_CONNECT(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           struct h1_tunnel_state *ts)
{
  struct connectdata *conn = cf->conn;
  CURLcode result;
  bool done;

  if(tunnel_is_established(ts))
    return CURLE_OK;
  if(tunnel_is_failed(ts))
    return CURLE_RECV_ERROR; /* Need a cfilter close and new bootstrap */

  do {
    timediff_t check;

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      /* Prepare the CONNECT request and make a first attempt to send. */
      CURL_TRC_CF(data, cf, "CONNECT start");
      result = start_CONNECT(cf, data, ts);
      if(result)
        goto out;
      h1_tunnel_go_state(cf, ts, H1_TUNNEL_CONNECT, data);
      FALLTHROUGH();

    case H1_TUNNEL_CONNECT:
      /* see that the request is completely sent */
      CURL_TRC_CF(data, cf, "CONNECT send");
      result = send_CONNECT(cf, data, ts, &done);
      if(result || !done)
        goto out;
      h1_tunnel_go_state(cf, ts, H1_TUNNEL_RECEIVE, data);
      FALLTHROUGH();

    case H1_TUNNEL_RECEIVE:
      /* read what is there */
      CURL_TRC_CF(data, cf, "CONNECT receive");
      result = recv_CONNECT_resp(cf, data, ts, &done);
      if(Curl_pgrsUpdate(data)) {
        result = CURLE_ABORTED_BY_CALLBACK;
        goto out;
      }
      /* error or not complete yet. return for more multi-multi */
      if(result || !done)
        goto out;
      /* got it */
      h1_tunnel_go_state(cf, ts, H1_TUNNEL_RESPONSE, data);
      FALLTHROUGH();

    case H1_TUNNEL_RESPONSE:
      CURL_TRC_CF(data, cf, "CONNECT response");
      if(data->req.newurl) {
        /* not the "final" response, we need to do a follow up request.
         * If the other side indicated a connection close, or if someone
         * else told us to close this connection, do so now.
         */
        if(ts->close_connection || conn->bits.close) {
          /* Close this filter and the sub-chain, re-connect the
           * sub-chain and continue. Closing this filter will
           * reset our tunnel state. To avoid recursion, we return
           * and expect to be called again.
           */
          CURL_TRC_CF(data, cf, "CONNECT need to close+open");
          infof(data, "Connect me again please");
          Curl_conn_cf_close(cf, data);
          connkeep(conn, "HTTP proxy CONNECT");
          result = Curl_conn_cf_connect(cf->next, data, FALSE, &done);
          goto out;
        }
        else {
          /* staying on this connection, reset state */
          h1_tunnel_go_state(cf, ts, H1_TUNNEL_INIT, data);
        }
      }
      break;

    default:
      break;
    }

  } while(data->req.newurl);

  DEBUGASSERT(ts->tunnel_state == H1_TUNNEL_RESPONSE);
  if(data->info.httpproxycode/100 != 2) {
    /* a non-2xx response and we have no next url to try. */
    Curl_safefree(data->req.newurl);
    /* failure, close this connection to avoid reuse */
    streamclose(conn, "proxy CONNECT failure");
    h1_tunnel_go_state(cf, ts, H1_TUNNEL_FAILED, data);
    failf(data, "CONNECT tunnel failed, response %d", data->req.httpcode);
    return CURLE_RECV_ERROR;
  }
  /* 2xx response, SUCCESS! */
  h1_tunnel_go_state(cf, ts, H1_TUNNEL_ESTABLISHED, data);
  infof(data, "CONNECT tunnel established, response %d",
        data->info.httpproxycode);
  result = CURLE_OK;

out:
  if(result)
    h1_tunnel_go_state(cf, ts, H1_TUNNEL_FAILED, data);
  return result;
}